

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::transcode_uastc_to_etc1
               (unpacked_uastc_block *unpacked_src_blk,color32 (*block_pixels) [4],void *pDst)

{
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0 aVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  byte *in_RDX;
  long in_RSI;
  long in_RDI;
  uint32_t in_stack_00000020;
  uint32_t in_stack_00000024;
  int db;
  int dg;
  int dr;
  etc_coord2 *c;
  uint32_t j;
  uint32_t avg_color [3];
  uint32_t subset;
  color32 block_colors [2];
  uint32_t limit;
  bool diff;
  bool flip;
  decoder_etc_block *dst_blk;
  uint32_t in_stack_ffffffffffffff7c;
  undefined5 in_stack_ffffffffffffff80;
  uint8_t uVar4;
  uint8_t in_stack_ffffffffffffff86;
  uint8_t in_stack_ffffffffffffff87;
  anon_union_4_3_898e29d3_for_color32_0 *local_68;
  int local_60;
  int local_5c;
  int local_58;
  uint uVar5;
  uint32_t in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  uint uVar6;
  anon_union_4_3_898e29d3_for_color32_0 local_30;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  anon_union_4_3_898e29d3_for_color32_0 local_28;
  byte local_22;
  byte local_21;
  byte *local_20;
  long local_10;
  long local_8;
  
  if (*(int *)(in_RDI + 0x68) == 8) {
    in_RDX[3] = (*(byte *)(in_RDI + 0x77) & 1) << 1 | (byte)(*(int *)(in_RDI + 0x78) << 5) |
                (byte)(*(int *)(in_RDI + 0x78) << 2);
    if ((*(byte *)(in_RDI + 0x77) & 1) == 0) {
      *in_RDX = (byte)*(undefined4 *)(in_RDI + 0x8c) | (byte)(*(int *)(in_RDI + 0x8c) << 4);
      in_RDX[1] = (byte)*(undefined4 *)(in_RDI + 0x90) | (byte)(*(int *)(in_RDI + 0x90) << 4);
      in_RDX[2] = (byte)*(undefined4 *)(in_RDI + 0x94) | (byte)(*(int *)(in_RDI + 0x94) << 4);
    }
    else {
      *in_RDX = (byte)(*(int *)(in_RDI + 0x8c) << 3);
      in_RDX[1] = (byte)(*(int *)(in_RDI + 0x90) << 3);
      in_RDX[2] = (byte)(*(int *)(in_RDI + 0x94) << 3);
    }
    *(undefined4 *)(in_RDX + 4) =
         *(undefined4 *)(s_etc1_solid_selectors + (ulong)*(uint *)(in_RDI + 0x88) * 4);
  }
  else {
    local_21 = (*(byte *)(in_RDI + 0x76) & 1) != 0;
    local_22 = (*(byte *)(in_RDI + 0x77) & 1) != 0;
    in_RDX[3] = local_21 | local_22 << 1 | (byte)(*(int *)(in_RDI + 0x78) << 5) |
                (byte)(*(int *)(in_RDI + 0x7c) << 2);
    local_28.m = 0xf;
    if ((bool)local_22) {
      local_28.m = 0x1f;
    }
    local_68 = &local_30;
    local_20 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    do {
      color32::color32((color32 *)&local_68->field_0);
      local_68 = local_68 + 1;
    } while (local_68 != &local_28);
    for (uVar6 = 0; uVar6 < 2; uVar6 = uVar6 + 1) {
      memset(&stack0xffffffffffffffc0,0,0xc);
      for (uVar5 = 0; uVar5 < 8; uVar5 = uVar5 + 1) {
        pbVar2 = g_etc1_pixel_coords +
                 (ulong)uVar5 * 2 + (ulong)uVar6 * 0x10 + (ulong)(local_21 & 1) * 0x20;
        in_stack_ffffffffffffffc0 =
             *(byte *)(local_10 + (ulong)pbVar2[1] * 0x10 + (ulong)*pbVar2 * 4) +
             in_stack_ffffffffffffffc0;
        in_stack_ffffffffffffffc4 =
             *(byte *)(local_10 + (ulong)pbVar2[1] * 0x10 + 1 + (ulong)*pbVar2 * 4) +
             in_stack_ffffffffffffffc4;
        in_stack_ffffffffffffffc8 =
             (uint)*(byte *)(local_10 + (ulong)pbVar2[1] * 0x10 + 2 + (ulong)*pbVar2 * 4) +
             in_stack_ffffffffffffffc8;
      }
      uVar4 = (uint8_t)((ulong)(in_stack_ffffffffffffffc0 * local_28.m + 0x3fc) / 0x7f8);
      puVar3 = color32::operator[]((color32 *)
                                   CONCAT17(in_stack_ffffffffffffff87,
                                            CONCAT16(in_stack_ffffffffffffff86,
                                                     CONCAT15(uVar4,in_stack_ffffffffffffff80))),
                                   in_stack_ffffffffffffff7c);
      *puVar3 = uVar4;
      in_stack_ffffffffffffff86 =
           (uint8_t)((ulong)(in_stack_ffffffffffffffc4 * local_28.m + 0x3fc) / 0x7f8);
      puVar3 = color32::operator[]((color32 *)
                                   CONCAT17(in_stack_ffffffffffffff87,
                                            CONCAT16(in_stack_ffffffffffffff86,
                                                     CONCAT15(uVar4,in_stack_ffffffffffffff80))),
                                   in_stack_ffffffffffffff7c);
      *puVar3 = in_stack_ffffffffffffff86;
      in_stack_ffffffffffffff87 =
           (uint8_t)((ulong)(in_stack_ffffffffffffffc8 * local_28.m + 0x3fc) / 0x7f8);
      puVar3 = color32::operator[]((color32 *)
                                   CONCAT17(in_stack_ffffffffffffff87,
                                            CONCAT16(in_stack_ffffffffffffff86,
                                                     CONCAT15(uVar4,in_stack_ffffffffffffff80))),
                                   in_stack_ffffffffffffff7c);
      *puVar3 = in_stack_ffffffffffffff87;
      puVar3 = color32::operator[]((color32 *)
                                   CONCAT17(in_stack_ffffffffffffff87,
                                            CONCAT16(in_stack_ffffffffffffff86,
                                                     CONCAT15(uVar4,in_stack_ffffffffffffff80))),
                                   in_stack_ffffffffffffff7c);
      *puVar3 = '\0';
      if (g_uastc_mode_has_etc1_bias[*(uint *)(local_8 + 0x68)] != '\0') {
        aVar1 = (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
                apply_etc1_bias((color32 *)CONCAT44(uVar6,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,uVar5);
        (&local_30)[uVar6].field_0 = aVar1;
      }
    }
    if ((local_22 & 1) == 0) {
      *local_20 = local_2c | local_30.field_0.r << 4;
      local_20[1] = local_2b | local_30.field_0.g << 4;
      local_20[2] = local_2a | local_30.field_0.b << 4;
    }
    else {
      uVar6 = (uint)local_30.field_0.g;
      uVar5 = (uint)local_30.field_0.b;
      local_58 = basisu::clamp<int>((uint)local_2c - (uint)local_30.field_0.r,-4,3);
      local_5c = basisu::clamp<int>(local_2b - uVar6,-4,3);
      local_60 = basisu::clamp<int>(local_2a - uVar5,-4,3);
      if (local_58 < 0) {
        local_58 = local_58 + 8;
      }
      if (local_5c < 0) {
        local_5c = local_5c + 8;
      }
      if (local_60 < 0) {
        local_60 = local_60 + 8;
      }
      *local_20 = local_30.field_0.r << 3 | (byte)local_58;
      local_20[1] = local_30.field_0.g << 3 | (byte)local_5c;
      local_20[2] = local_30.field_0.b << 3 | (byte)local_60;
    }
    etc1_determine_selectors(_dr,_db,in_stack_00000024,in_stack_00000020);
  }
  return;
}

Assistant:

void transcode_uastc_to_etc1(unpacked_uastc_block& unpacked_src_blk, color32 block_pixels[4][4], void* pDst)
	{
		decoder_etc_block& dst_blk = *static_cast<decoder_etc_block*>(pDst);

		if (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			dst_blk.m_bytes[3] = (uint8_t)((unpacked_src_blk.m_etc1_diff << 1) | (unpacked_src_blk.m_etc1_inten0 << 5) | (unpacked_src_blk.m_etc1_inten0 << 2));

			if (unpacked_src_blk.m_etc1_diff)
			{
				dst_blk.m_bytes[0] = (uint8_t)(unpacked_src_blk.m_etc1_r << 3);
				dst_blk.m_bytes[1] = (uint8_t)(unpacked_src_blk.m_etc1_g << 3);
				dst_blk.m_bytes[2] = (uint8_t)(unpacked_src_blk.m_etc1_b << 3);
			}
			else
			{
				dst_blk.m_bytes[0] = (uint8_t)(unpacked_src_blk.m_etc1_r | (unpacked_src_blk.m_etc1_r << 4));
				dst_blk.m_bytes[1] = (uint8_t)(unpacked_src_blk.m_etc1_g | (unpacked_src_blk.m_etc1_g << 4));
				dst_blk.m_bytes[2] = (uint8_t)(unpacked_src_blk.m_etc1_b | (unpacked_src_blk.m_etc1_b << 4));
			}

			memcpy(dst_blk.m_bytes + 4, &s_etc1_solid_selectors[unpacked_src_blk.m_etc1_selector][0], 4);

			return;
		}

		const bool flip = unpacked_src_blk.m_etc1_flip != 0;
		const bool diff = unpacked_src_blk.m_etc1_diff != 0;

		dst_blk.m_bytes[3] = (uint8_t)((int)flip | (diff << 1) | (unpacked_src_blk.m_etc1_inten0 << 5) | (unpacked_src_blk.m_etc1_inten1 << 2));

		const uint32_t limit = diff ? 31 : 15;

		color32 block_colors[2];

		for (uint32_t subset = 0; subset < 2; subset++)
		{
			uint32_t avg_color[3];
			memset(avg_color, 0, sizeof(avg_color));

			for (uint32_t j = 0; j < 8; j++)
			{
				const etc_coord2& c = g_etc1_pixel_coords[flip][subset][j];

				avg_color[0] += block_pixels[c.m_y][c.m_x].r;
				avg_color[1] += block_pixels[c.m_y][c.m_x].g;
				avg_color[2] += block_pixels[c.m_y][c.m_x].b;
			} // j

			block_colors[subset][0] = (uint8_t)((avg_color[0] * limit + 1020) / (8 * 255));
			block_colors[subset][1] = (uint8_t)((avg_color[1] * limit + 1020) / (8 * 255));
			block_colors[subset][2] = (uint8_t)((avg_color[2] * limit + 1020) / (8 * 255));
			block_colors[subset][3] = 0;

			if (g_uastc_mode_has_etc1_bias[unpacked_src_blk.m_mode])
			{
				block_colors[subset] = apply_etc1_bias(block_colors[subset], unpacked_src_blk.m_etc1_bias, limit, subset);
			}

		} // subset

		if (diff)
		{
			int dr = block_colors[1].r - block_colors[0].r;
			int dg = block_colors[1].g - block_colors[0].g;
			int db = block_colors[1].b - block_colors[0].b;

			dr = basisu::clamp<int>(dr, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			dg = basisu::clamp<int>(dg, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			db = basisu::clamp<int>(db, cETC1ColorDeltaMin, cETC1ColorDeltaMax);

			if (dr < 0) dr += 8;
			if (dg < 0) dg += 8;
			if (db < 0) db += 8;

			dst_blk.m_bytes[0] = (uint8_t)((block_colors[0].r << 3) | dr);
			dst_blk.m_bytes[1] = (uint8_t)((block_colors[0].g << 3) | dg);
			dst_blk.m_bytes[2] = (uint8_t)((block_colors[0].b << 3) | db);
		}
		else
		{
			dst_blk.m_bytes[0] = (uint8_t)(block_colors[1].r | (block_colors[0].r << 4));
			dst_blk.m_bytes[1] = (uint8_t)(block_colors[1].g | (block_colors[0].g << 4));
			dst_blk.m_bytes[2] = (uint8_t)(block_colors[1].b | (block_colors[0].b << 4));
		}

		etc1_determine_selectors(dst_blk, &block_pixels[0][0], 0, 2);
	}